

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  ImGuiContext *pIVar2;
  char *text_end;
  ImVec2 size;
  double dVar3;
  double dVar4;
  undefined4 uVar5;
  ImVec4 cf;
  
  pIVar2 = GImGui;
  text_end = (char *)0x0;
  BeginTooltipEx(0,1);
  if (text != (char *)0x0) {
    text_end = FindRenderedTextEnd(text,(char *)0x0);
  }
  if (text < text_end) {
    TextEx(text,text_end,0);
    if (GImGui->CurrentWindow->SkipItems == false) {
      SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
    }
  }
  fVar1 = (pIVar2->Style).FramePadding.y;
  size.x = pIVar2->FontSize * 3.0 + fVar1 + fVar1;
  cf.x = *col;
  cf.y = col[1];
  cf.z = col[2];
  cf.w = 1.0;
  if ((flags & 2U) == 0) {
    cf.w = col[3];
  }
  size.y = size.x;
  ColorButton("##preview",&cf,flags & 0x18060002U | 0x40,size);
  SameLine(0.0,-1.0);
  dVar3 = (double)*col;
  dVar4 = (double)col[1];
  uVar5 = SUB84((double)col[2],0);
  if ((flags & 0x18000000U) == 0x10000000) {
    if ((flags & 2U) == 0) {
      Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f",dVar3,dVar4,uVar5,SUB84((double)col[3],0));
    }
    else {
      Text("H: %.3f, S: %.3f, V: %.3f",dVar3,dVar4,uVar5);
    }
  }
  else if ((flags & 2U) == 0) {
    Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",dVar3,dVar4,uVar5,
         SUB84((double)col[3],0));
  }
  else {
    Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",dVar3,dVar4,uVar5);
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    BeginTooltipEx(0, ImGuiTooltipFlags_OverridePreviousTooltip);
    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextEx(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ImVec4 cf(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    ColorButton("##preview", cf, (flags & (ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if ((flags & ImGuiColorEditFlags_InputRGB) || !(flags & ImGuiColorEditFlags__InputMask))
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
        else
            Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("H: %.3f, S: %.3f, V: %.3f", col[0], col[1], col[2]);
        else
            Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f", col[0], col[1], col[2], col[3]);
    }
    EndTooltip();
}